

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode http_setup_conn(connectdata *conn)

{
  Curl_easy *pCVar1;
  CURLcode CVar2;
  void *pvVar3;
  
  pCVar1 = conn->data;
  pvVar3 = (*Curl_ccalloc)(1,0x218);
  if (pvVar3 == (void *)0x0) {
    CVar2 = CURLE_OUT_OF_MEMORY;
  }
  else {
    Curl_mime_initpart((curl_mimepart *)((long)pvVar3 + 0x28),conn->data);
    (pCVar1->req).protop = pvVar3;
    CVar2 = CURLE_OK;
  }
  return CVar2;
}

Assistant:

static CURLcode http_setup_conn(struct connectdata *conn)
{
  /* allocate the HTTP-specific struct for the Curl_easy, only to survive
     during this request */
  struct HTTP *http;
  struct Curl_easy *data = conn->data;
  DEBUGASSERT(data->req.protop == NULL);

  http = calloc(1, sizeof(struct HTTP));
  if(!http)
    return CURLE_OUT_OF_MEMORY;

  Curl_mime_initpart(&http->form, conn->data);
  data->req.protop = http;

  if(!CONN_INUSE(conn))
    /* if not already multi-using, setup connection details */
    Curl_http2_setup_conn(conn);
  Curl_http2_setup_req(data);
  return CURLE_OK;
}